

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

void __thiscall choc::value::Type::ComplexArray::RepeatedGroup::~RepeatedGroup(RepeatedGroup *this)

{
  MainType MVar1;
  Object *this_00;
  Allocator *pAVar2;
  
  MVar1 = (this->elementType).mainType;
  if ((char)MVar1 < '\0') {
    if (MVar1 == object) {
      this_00 = (this->elementType).content.object;
      if (this_00 != (Object *)0x0) {
        pAVar2 = (this->elementType).allocator;
        Object::~Object(this_00);
        goto LAB_001e3fbc;
      }
    }
    else if ((MVar1 == complexArray) &&
            (this_00 = (this->elementType).content.object, this_00 != (Object *)0x0)) {
      pAVar2 = (this->elementType).allocator;
      AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)this_00);
LAB_001e3fbc:
      if (pAVar2 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar2 + 0x20))(pAVar2,this_00);
        return;
      }
      free(this_00);
      return;
    }
  }
  return;
}

Assistant:

inline void Type::deleteAllocatedObjects() noexcept
{
    if (static_cast<int8_t> (mainType) < 0)
    {
        if (isType (MainType::complexArray))   freeObject (allocator, content.complexArray);
        else if (isType (MainType::object))    freeObject (allocator, content.object);
    }
}